

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O3

void do_cmd_reshape(command *cmd)

{
  _Bool _Var1;
  wchar_t subtype;
  char *pcVar2;
  char *name;
  source sVar3;
  source origin;
  _Bool ident;
  
  _Var1 = player_is_shapechanged(player);
  if ((!_Var1) &&
     (_Var1 = flag_has_dbg((player->state).pflags,10,0x14,"player->state.pflags","(PF_BEARSKIN)"),
     !_Var1)) {
    return;
  }
  _Var1 = player_is_shapechanged(player);
  if (_Var1) {
    _Var1 = get_check("Change back to your original form? ");
    if (_Var1) {
      player_resume_normal_shape(player);
      return;
    }
  }
  else {
    pcVar2 = "great bear";
    if (player->lev < 0x28) {
      pcVar2 = "bear";
    }
    name = "bear cub";
    if (0x13 < player->lev) {
      name = pcVar2;
    }
    pcVar2 = format("Assume the form of a %s? ",name);
    _Var1 = get_check(pcVar2);
    if (_Var1) {
      sVar3 = source_none();
      origin.which = sVar3.which;
      subtype = shape_name_to_idx(name);
      origin._4_4_ = 0;
      origin.what = sVar3.what;
      effect_simple(L'k',origin,"0",subtype,L'\0',L'\0',L'\0',L'\0',&ident);
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
  }
  return;
}

Assistant:

void do_cmd_reshape(struct command *cmd)
{
	/* Sanity */
	if (!(player_is_shapechanged(player) || player_has(player, PF_BEARSKIN))) {
		return;
	}

	/* Change back or change */
	if (player_is_shapechanged(player)) {
		if (get_check("Change back to your original form? " )) {
			player_resume_normal_shape(player);
		}
		return;
	} else {
		bool ident;
		const char *shape_name = (player->lev < 20) ? "bear cub" :
			((player->lev < 40) ? "bear" : "great bear");

		/* Confirm */
		if (!get_check(format("Assume the form of a %s? ", shape_name)))
			return;

		/* Change */
		effect_simple(EF_SHAPECHANGE, source_none(), "0",
					  shape_name_to_idx(shape_name), 0, 0, 0, 0, &ident);

		/* Use some energy */
		player->upkeep->energy_use = z_info->move_energy;
	}
}